

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::AddCustomCommandToOutput
          (cmMakefile *this,unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,
          CommandSourceCallback *callback,bool replace)

{
  bool bVar1;
  pointer pcVar2;
  anon_class_48_3_501fcf24 local_c0;
  cmStateSnapshot local_90;
  allocator<char> local_61;
  string local_60;
  cmCustomCommandLines *local_40;
  cmCustomCommandLines *commandLines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  CommandSourceCallback *pCStack_20;
  bool replace_local;
  CommandSourceCallback *callback_local;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  cmMakefile *this_local;
  
  outputs._7_1_ = replace;
  pCStack_20 = callback;
  callback_local = (CommandSourceCallback *)cc;
  cc_local = (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)this;
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  byproducts = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar2);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  commandLines = (cmCustomCommandLines *)cmCustomCommand::GetByproducts_abi_cxx11_(pcVar2);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  local_40 = cmCustomCommand::GetCommandLines(pcVar2);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(byproducts);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"Attempt to add a custom rule with no output!",&local_61);
    cmSystemTools::Error(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  else {
    bVar1 = ValidateCustomCommand(this,local_40);
    if (bVar1) {
      CreateGeneratedOutputs(this,byproducts);
      CreateGeneratedOutputs
                (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)commandLines);
      pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                         (cc);
      GetStateSnapshot(&local_90,this);
      cmCustomCommand::RecordPolicyValues(pcVar2,&local_90);
      local_c0.replace = (bool)(outputs._7_1_ & 1);
      local_c0.this = this;
      std::function<void_(cmSourceFile_*)>::function(&local_c0.callback,pCStack_20);
      AddGeneratorAction<std::unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>>,cmMakefile::AddCustomCommandToOutput(std::unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>>,std::function<void(cmSourceFile*)>const&,bool)::__0>
                (this,cc,&local_c0);
      AddCustomCommandToOutput(std::unique_ptr<cmCustomCommand,std::default_delete<cmCustomCommand>>,std::function<void(cmSourceFile*)>const&,bool)
      ::$_0::~__0((__0 *)&local_c0);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddCustomCommandToOutput(
  std::unique_ptr<cmCustomCommand> cc, const CommandSourceCallback& callback,
  bool replace)
{
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Make sure there is at least one output.
  if (outputs.empty()) {
    cmSystemTools::Error("Attempt to add a custom rule with no output!");
    return;
  }

  // Validate custom commands.
  if (!this->ValidateCustomCommand(commandLines)) {
    return;
  }

  // Always create the output sources and mark them generated.
  this->CreateGeneratedOutputs(outputs);
  this->CreateGeneratedOutputs(byproducts);

  cc->RecordPolicyValues(this->GetStateSnapshot());

  // Dispatch command creation to allow generator expressions in outputs.
  this->AddGeneratorAction(
    std::move(cc),
    [this, replace, callback](cmLocalGenerator& lg,
                              const cmListFileBacktrace& lfbt,
                              std::unique_ptr<cmCustomCommand> tcc) {
      BacktraceGuard guard(this->Backtrace, lfbt);
      tcc->SetBacktrace(lfbt);
      cmSourceFile* sf = detail::AddCustomCommandToOutput(
        lg, cmCommandOrigin::Project, std::move(tcc), replace);
      if (callback && sf) {
        callback(sf);
      }
    });
}